

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall Assimp::IFC::Schema_2x3::IfcElementType::~IfcElementType(IfcElementType *this)

{
  undefined1 *puVar1;
  
  *(undefined8 *)&(this->super_IfcTypeProduct).super_IfcTypeObject = 0x87fbe8;
  *(undefined8 *)&this->field_0x180 = 0x87fcb0;
  *(undefined8 *)&(this->super_IfcTypeProduct).super_IfcTypeObject.field_0x88 = 0x87fc10;
  (this->super_IfcTypeProduct).super_IfcTypeObject.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcTypeObject,_2UL>._vptr_ObjectHelper =
       (_func_int **)0x87fc38;
  *(undefined8 *)&(this->super_IfcTypeProduct).super_IfcTypeObject.field_0xf0 = 0x87fc60;
  *(undefined8 *)&(this->super_IfcTypeProduct).field_0x148 = 0x87fc88;
  puVar1 = *(undefined1 **)&(this->super_IfcTypeProduct).field_0x158;
  if (puVar1 != &this->field_0x168) {
    operator_delete(puVar1);
  }
  IfcTypeProduct::~IfcTypeProduct(&this->super_IfcTypeProduct,&PTR_construction_vtable_24__0087fcc8)
  ;
  operator_delete(this);
  return;
}

Assistant:

IfcElementType() : Object("IfcElementType") {}